

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int32_t mipsdsp_mul_i16_i16(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  int32_t temp;
  CPUMIPSState_conflict5 *env_local;
  int16_t b_local;
  int16_t a_local;
  
  uVar1 = (int)a * (int)b;
  if ((0x7fff < (int)uVar1) || ((int)uVar1 < -0x8000)) {
    set_DSPControl_overflow_flag(1,0x15,env);
  }
  return uVar1 & 0xffff;
}

Assistant:

static inline int32_t mipsdsp_mul_i16_i16(int16_t a, int16_t b,
                                          CPUMIPSState *env)
{
    int32_t temp;

    temp = (int32_t)a * (int32_t)b;

    if ((temp > (int)0x7FFF) || (temp < (int)0xFFFF8000)) {
        set_DSPControl_overflow_flag(1, 21, env);
    }
    temp &= 0x0000FFFF;

    return temp;
}